

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int libssh2_userauth_publickey_frommemory
              (LIBSSH2_SESSION *session,char *user,size_t user_len,char *publickeyfiledata,
              size_t publickeyfiledata_len,char *privatekeyfiledata,size_t privatekeyfiledata_len,
              char *passphrase)

{
  int iVar1;
  time_t start_time;
  char *passphrase_00;
  bool bVar2;
  uchar *pubkeydata;
  size_t pubkeydata_len;
  privkey_mem privkey_mem;
  uchar *local_90;
  size_t local_88;
  char *local_80;
  size_t *local_78;
  uchar **local_70;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char **local_50;
  char *local_48;
  char *local_40;
  size_t local_38;
  
  passphrase_00 = "";
  if (passphrase != (char *)0x0) {
    passphrase_00 = passphrase;
  }
  local_80 = publickeyfiledata;
  local_60 = user;
  local_58 = user_len;
  start_time = time((time_t *)0x0);
  bVar2 = local_80 == (char *)0x0;
  local_70 = &session->userauth_pblc_method;
  local_78 = &session->userauth_pblc_method_len;
  local_68 = publickeyfiledata_len;
  do {
    local_90 = (uchar *)0x0;
    local_88 = 0;
    local_50 = &local_48;
    local_38 = privatekeyfiledata_len;
    local_48 = passphrase_00;
    local_40 = privatekeyfiledata;
    if (session->userauth_pblc_state == libssh2_NB_state_idle) {
      if (bVar2 || publickeyfiledata_len == 0) {
        if (privatekeyfiledata != (char *)0x0 && privatekeyfiledata_len != 0) {
          iVar1 = _libssh2_pub_priv_keyfilememory
                            (session,local_70,local_78,&local_90,&local_88,privatekeyfiledata,
                             privatekeyfiledata_len,passphrase_00);
          goto LAB_0011d90a;
        }
        iVar1 = _libssh2_error(session,-0x10,"Invalid data in public and private key.");
      }
      else {
        iVar1 = memory_read_publickey
                          (session,local_70,local_78,&local_90,&local_88,local_80,local_68);
LAB_0011d90a:
        if (iVar1 == 0) goto LAB_0011d860;
      }
    }
    else {
LAB_0011d860:
      iVar1 = _libssh2_userauth_publickey
                        (session,local_60,local_58,local_90,local_88,sign_frommemory,&local_50);
      if (local_90 != (uchar *)0x0) {
        (*session->free)(local_90,&session->abstract);
      }
    }
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

static int
userauth_publickey_frommemory(LIBSSH2_SESSION *session,
                              const char *username,
                              size_t username_len,
                              const char *publickeydata,
                              size_t publickeydata_len,
                              const char *privatekeydata,
                              size_t privatekeydata_len,
                              const char *passphrase)
{
    unsigned char *pubkeydata = NULL;
    size_t pubkeydata_len = 0;
    struct privkey_mem privkey_mem;
    void *abstract = &privkey_mem;
    int rc;

    privkey_mem.data = privatekeydata;
    privkey_mem.data_len = privatekeydata_len;
    privkey_mem.passphrase = passphrase;

    if(session->userauth_pblc_state == libssh2_NB_state_idle) {
        if(publickeydata_len && publickeydata) {
            rc = memory_read_publickey(session, &session->userauth_pblc_method,
                                       &session->userauth_pblc_method_len,
                                       &pubkeydata, &pubkeydata_len,
                                       publickeydata, publickeydata_len);
            if(rc)
                return rc;
        }
        else if(privatekeydata_len && privatekeydata) {
            /* Compute public key from private key. */
            rc = _libssh2_pub_priv_keyfilememory(session,
                                            &session->userauth_pblc_method,
                                            &session->userauth_pblc_method_len,
                                            &pubkeydata, &pubkeydata_len,
                                            privatekeydata, privatekeydata_len,
                                            passphrase);
            if(rc)
                return rc;
        }
        else {
            return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                                  "Invalid data in public and private key.");
        }
    }

    rc = _libssh2_userauth_publickey(session, username, username_len,
                                     pubkeydata, pubkeydata_len,
                                     sign_frommemory, &abstract);
    if(pubkeydata)
        LIBSSH2_FREE(session, pubkeydata);

    return rc;
}